

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O3

bool __thiscall
QHttp2ProtocolHandler::sendHEADERS
          (QHttp2ProtocolHandler *this,QHttp2Stream *stream,QHttpNetworkRequest *request)

{
  uint uVar1;
  int *piVar2;
  bool bVar3;
  char cVar4;
  ProxyType PVar5;
  QHttpNetworkRequestPrivate *pQVar6;
  HeaderSize HVar7;
  qsizetype qVar8;
  HPack *this_00;
  QNonContiguousByteDevice *pQVar9;
  char *pcVar10;
  char *pcVar11;
  qsizetype qVar12;
  storage_type *in_R8;
  long i;
  uint uVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  QLatin1StringView QVar15;
  QByteArrayView QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QByteArrayView name;
  QByteArrayView value;
  QHttpHeaders requestHeader;
  HttpHeader local_c8;
  QHttpHeaders local_b0;
  QByteArray local_a8;
  QByteArray local_90;
  QByteArray local_78;
  vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  PVar5 = QNetworkProxy::type((QNetworkProxy *)(*(long *)(*(long *)(this + 0x30) + 8) + 0xc0));
  bVar3 = QHttpNetworkRequest::withCredentials(request);
  if (bVar3) {
    QHttpNetworkConnectionPrivate::createAuthorization
              (*(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0x30) + 8),
               *(QIODevice **)(this + 0x28),request);
    pQVar6 = (request->d).d.ptr;
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar6->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QHttpNetworkRequestPrivate>::detach_helper(&request->d);
      pQVar6 = (request->d).d.ptr;
    }
    pQVar6->needResendWithCredentials = false;
  }
  local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  uVar1 = *(uint *)(*(long *)(this + 0x38) + 0x2a4);
  local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::reserve(&local_58,300);
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d._0_4_ = 0xaaaaaaaa;
  local_78.d.d._4_4_ = 0xaaaaaaaa;
  local_78.d.ptr._0_4_ = 0xaaaaaaaa;
  local_78.d.ptr._4_4_ = 0xaaaaaaaa;
  (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[2])(&local_a8,request);
  QUrl::authority(&local_90,&local_a8,0x1f00006);
  QString::toLatin1_helper_inplace((QString *)&local_78);
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
    }
  }
  QUrl::~QUrl((QUrl *)&local_a8);
  std::vector<HPack::HeaderField,std::allocator<HPack::HeaderField>>::
  emplace_back<char_const(&)[11],QByteArray_const&>
            ((vector<HPack::HeaderField,std::allocator<HPack::HeaderField>> *)&local_58,
             (char (*) [11])":authority",&local_78);
  QHttpNetworkRequest::methodName(&local_90,request);
  std::vector<HPack::HeaderField,std::allocator<HPack::HeaderField>>::
  emplace_back<char_const(&)[8],QByteArray>
            ((vector<HPack::HeaderField,std::allocator<HPack::HeaderField>> *)&local_58,
             (char (*) [8])":method",&local_90);
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
    }
  }
  QHttpNetworkRequest::uri(&local_90,request,PVar5 != NoProxy);
  std::vector<HPack::HeaderField,std::allocator<HPack::HeaderField>>::
  emplace_back<char_const(&)[6],QByteArray>
            ((vector<HPack::HeaderField,std::allocator<HPack::HeaderField>> *)&local_58,
             (char (*) [6])":path",&local_90);
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
    }
  }
  (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[2])(&local_b0,request);
  QUrl::scheme();
  QString::toLatin1_helper_inplace((QString *)&local_90);
  std::vector<HPack::HeaderField,std::allocator<HPack::HeaderField>>::
  emplace_back<char_const(&)[8],QByteArray>
            ((vector<HPack::HeaderField,std::allocator<HPack::HeaderField>> *)&local_58,
             (char (*) [8])":scheme",&local_90);
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QUrl::~QUrl((QUrl *)&local_b0);
  HVar7 = HPack::header_size(&local_58);
  if ((((ulong)HVar7 & 1) == 0) || (uVar14 = (ulong)HVar7 >> 0x20, uVar1 < HVar7.second)) {
    local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_b0.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[8])(&local_b0,request);
    qVar8 = QHttpHeaders::size(&local_b0);
    if (0 < qVar8) {
      i = 0;
      while( true ) {
        QVar15 = QHttpHeaders::nameAt(&local_b0,i);
        pcVar11 = QVar15.m_data;
        this_00 = (HPack *)QVar15.m_size;
        QVar16 = QHttpHeaders::valueAt(&local_b0,i);
        name.m_data = (storage_type *)QVar16.m_size;
        name.m_size = (qsizetype)pcVar11;
        value.m_data = in_R8;
        value.m_size = (qsizetype)QVar16.m_data;
        HVar7 = HPack::entry_size(this_00,name,value);
        if (((ulong)HVar7 & 1) == 0) break;
        if ((~HVar7.second < (uint)uVar14) ||
           (uVar13 = (uint)uVar14 + HVar7.second, uVar14 = (ulong)uVar13, uVar1 < uVar13)) break;
        if ((long)this_00 < 0x10) {
          if (this_00 == (HPack *)&DAT_00000004) {
            qVar12 = 4;
            qVar8 = 4;
            pcVar10 = "host";
            goto LAB_001f4b02;
          }
          if (this_00 != (HPack *)0xa) goto LAB_001f4b0b;
          QVar17.m_data = "connection";
          QVar17.m_size = 10;
          QVar19.m_data = pcVar11;
          QVar19.m_size = 10;
          cVar4 = QtPrivate::equalStrings(QVar19,QVar17);
          if (cVar4 == '\0') {
            qVar12 = 10;
            qVar8 = 10;
            pcVar10 = "keep-alive";
            goto LAB_001f4b02;
          }
        }
        else {
          if (this_00 == (HPack *)0x10) {
            qVar12 = 0x10;
            qVar8 = 0x10;
            pcVar10 = "proxy-connection";
          }
          else {
            if (this_00 != (HPack *)0x11) goto LAB_001f4b0b;
            qVar12 = 0x11;
            qVar8 = 0x11;
            pcVar10 = "transfer-encoding";
          }
LAB_001f4b02:
          QVar18.m_data = pcVar10;
          QVar18.m_size = qVar8;
          QVar20.m_data = pcVar11;
          QVar20.m_size = qVar12;
          cVar4 = QtPrivate::equalStrings(QVar20,QVar18);
          if (cVar4 == '\0') {
LAB_001f4b0b:
            QByteArray::QByteArray(&local_90,pcVar11,(longlong)this_00);
            QByteArray::QByteArray(&local_a8,QVar16.m_data,(longlong)QVar16.m_size);
            std::vector<HPack::HeaderField,std::allocator<HPack::HeaderField>>::
            emplace_back<QByteArray,QByteArray>
                      ((vector<HPack::HeaderField,std::allocator<HPack::HeaderField>> *)&local_58,
                       &local_90,&local_a8);
            if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
              }
            }
            if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
              }
            }
          }
        }
        i = i + 1;
        qVar8 = QHttpHeaders::size(&local_b0);
        if (qVar8 <= i) break;
      }
    }
    local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    QHttpHeaders::~QHttpHeaders(&local_b0);
  }
  piVar2 = (int *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_),1,0x10);
    }
  }
  std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::~vector(&local_58);
  if (local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_c8.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar3 = false;
  }
  else {
    pQVar9 = QHttpNetworkRequest::uploadByteDevice(request);
    bVar3 = QHttp2Stream::sendHEADERS
                      ((QHttp2Stream *)stream,&local_c8,pQVar9 == (QNonContiguousByteDevice *)0x0,
                       '\x7f');
  }
  std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::~vector(&local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2ProtocolHandler::sendHEADERS(QHttp2Stream *stream, QHttpNetworkRequest &request)
{
    using namespace HPack;

    bool useProxy = false;
#ifndef QT_NO_NETWORKPROXY
    useProxy = m_connection->d_func()->networkProxy.type() != QNetworkProxy::NoProxy;
#endif
    if (request.withCredentials()) {
        m_connection->d_func()->createAuthorization(m_socket, request);
        request.d->needResendWithCredentials = false;
    }
    const auto headers = build_headers(request, h2Connection->maxHeaderListSize(), useProxy);
    if (headers.empty()) // nothing fits into maxHeaderListSize
        return false;

    bool mustUploadData = request.uploadByteDevice();
    return stream->sendHEADERS(headers, !mustUploadData);
}